

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n_left_move<VkSpecParser::Command*,long_long>
               (Command *first,longlong n,Command *d_first)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  TypedName *pTVar5;
  QArrayDataPointer<VkSpecParser::TypedName> *this;
  Command *pCVar6;
  Command *pCVar7;
  Command *pCVar8;
  Command *pCVar9;
  long in_FS_OFFSET;
  Destructor local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.iter = &local_48.intermediate;
  pCVar7 = d_first + n;
  pCVar9 = first;
  pCVar6 = pCVar7;
  if (first < pCVar7) {
    pCVar9 = pCVar7;
    pCVar6 = first;
  }
  pCVar8 = d_first;
  if (pCVar6 != d_first) {
    do {
      pDVar1 = (first->cmd).name.d.d;
      (first->cmd).name.d.d = (Data *)0x0;
      (pCVar8->cmd).name.d.d = pDVar1;
      pcVar2 = (first->cmd).name.d.ptr;
      (first->cmd).name.d.ptr = (char16_t *)0x0;
      (pCVar8->cmd).name.d.ptr = pcVar2;
      qVar3 = (first->cmd).name.d.size;
      (first->cmd).name.d.size = 0;
      (pCVar8->cmd).name.d.size = qVar3;
      pDVar1 = (first->cmd).type.d.d;
      (first->cmd).type.d.d = (Data *)0x0;
      (pCVar8->cmd).type.d.d = pDVar1;
      pcVar2 = (first->cmd).type.d.ptr;
      (first->cmd).type.d.ptr = (char16_t *)0x0;
      (pCVar8->cmd).type.d.ptr = pcVar2;
      qVar3 = (first->cmd).type.d.size;
      (first->cmd).type.d.size = 0;
      (pCVar8->cmd).type.d.size = qVar3;
      pDVar1 = (first->cmd).typeSuffix.d.d;
      (first->cmd).typeSuffix.d.d = (Data *)0x0;
      (pCVar8->cmd).typeSuffix.d.d = pDVar1;
      pcVar2 = (first->cmd).typeSuffix.d.ptr;
      (first->cmd).typeSuffix.d.ptr = (char16_t *)0x0;
      (pCVar8->cmd).typeSuffix.d.ptr = pcVar2;
      qVar3 = (first->cmd).typeSuffix.d.size;
      (first->cmd).typeSuffix.d.size = 0;
      (pCVar8->cmd).typeSuffix.d.size = qVar3;
      pDVar4 = (first->args).d.d;
      (first->args).d.d = (Data *)0x0;
      (pCVar8->args).d.d = pDVar4;
      pTVar5 = (first->args).d.ptr;
      (first->args).d.ptr = (TypedName *)0x0;
      (pCVar8->args).d.ptr = pTVar5;
      qVar3 = (first->args).d.size;
      (first->args).d.size = 0;
      (pCVar8->args).d.size = qVar3;
      pCVar8->deviceLevel = first->deviceLevel;
      pCVar8 = pCVar8 + 1;
      first = first + 1;
    } while (pCVar8 != pCVar6);
  }
  local_48.end = d_first;
  local_48.intermediate = pCVar8;
  for (; pCVar8 != pCVar7; pCVar8 = pCVar8 + 1) {
    pDVar1 = (pCVar8->cmd).name.d.d;
    (pCVar8->cmd).name.d.d = (first->cmd).name.d.d;
    (first->cmd).name.d.d = pDVar1;
    pcVar2 = (pCVar8->cmd).name.d.ptr;
    (pCVar8->cmd).name.d.ptr = (first->cmd).name.d.ptr;
    (first->cmd).name.d.ptr = pcVar2;
    qVar3 = (pCVar8->cmd).name.d.size;
    (pCVar8->cmd).name.d.size = (first->cmd).name.d.size;
    (first->cmd).name.d.size = qVar3;
    pDVar1 = (pCVar8->cmd).type.d.d;
    (pCVar8->cmd).type.d.d = (first->cmd).type.d.d;
    (first->cmd).type.d.d = pDVar1;
    pcVar2 = (pCVar8->cmd).type.d.ptr;
    (pCVar8->cmd).type.d.ptr = (first->cmd).type.d.ptr;
    (first->cmd).type.d.ptr = pcVar2;
    qVar3 = (pCVar8->cmd).type.d.size;
    (pCVar8->cmd).type.d.size = (first->cmd).type.d.size;
    (first->cmd).type.d.size = qVar3;
    pDVar1 = (pCVar8->cmd).typeSuffix.d.d;
    (pCVar8->cmd).typeSuffix.d.d = (first->cmd).typeSuffix.d.d;
    (first->cmd).typeSuffix.d.d = pDVar1;
    pcVar2 = (pCVar8->cmd).typeSuffix.d.ptr;
    (pCVar8->cmd).typeSuffix.d.ptr = (first->cmd).typeSuffix.d.ptr;
    (first->cmd).typeSuffix.d.ptr = pcVar2;
    qVar3 = (pCVar8->cmd).typeSuffix.d.size;
    (pCVar8->cmd).typeSuffix.d.size = (first->cmd).typeSuffix.d.size;
    (first->cmd).typeSuffix.d.size = qVar3;
    QArrayDataPointer<VkSpecParser::TypedName>::operator=(&(pCVar8->args).d,&(first->args).d);
    pCVar8->deviceLevel = first->deviceLevel;
    first = first + 1;
  }
  local_48.iter = &local_48.end;
  if (first != pCVar9) {
    this = &first[-1].args.d;
    do {
      QArrayDataPointer<VkSpecParser::TypedName>::~QArrayDataPointer(this);
      pDVar4 = this[-1].d;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(this[-1].d)->super_QArrayData,2,0x10);
        }
      }
      pDVar4 = this[-2].d;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(this[-2].d)->super_QArrayData,2,0x10);
        }
      }
      pDVar4 = this[-3].d;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(this[-3].d)->super_QArrayData,2,0x10);
        }
      }
      pCVar6 = (Command *)(this + -3);
      this = (QArrayDataPointer<VkSpecParser::TypedName> *)&this[-5].size;
    } while (pCVar6 != pCVar9);
  }
  q_relocate_overlap_n_left_move<VkSpecParser::Command_*,_long_long>::Destructor::~Destructor
            (&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}